

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void buffer_mremap(mmt_mremap *mm)

{
  cpu_mapping *pcVar1;
  uint8_t *puVar2;
  cpu_mapping *mapping;
  mmt_mremap *mm_local;
  
  pcVar1 = get_cpu_mapping(mm->id);
  if (mm->len != pcVar1->length) {
    puVar2 = (uint8_t *)realloc(pcVar1->data,mm->len);
    pcVar1->data = puVar2;
    if (pcVar1->length < mm->len) {
      memset(pcVar1->data + pcVar1->length,0,mm->len - pcVar1->length);
    }
  }
  pcVar1->mmap_offset = mm->offset;
  pcVar1->cpu_addr = mm->start;
  pcVar1->length = mm->len;
  return;
}

Assistant:

void buffer_mremap(struct mmt_mremap *mm)
{
	struct cpu_mapping *mapping = get_cpu_mapping(mm->id);
	if (mm->len != mapping->length)
	{
		mapping->data = realloc(mapping->data, mm->len);
		if (mm->len > mapping->length)
			memset(mapping->data + mapping->length, 0, mm->len - mapping->length);
	}

	mapping->mmap_offset = mm->offset;
	mapping->cpu_addr = mm->start;
	mapping->length = mm->len;
}